

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

void wasm::ParamUtils::localizeCallsTo
               (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *callTargets,Module *wasm,PassRunner *runner,
               function<void_(wasm::Function_*)> *onChange)

{
  Pass local_1a8 [3];
  void *local_a0;
  long local_90;
  undefined1 local_70 [16];
  code *local_60;
  _Any_data local_48;
  code *local_38;
  
  std::function<void_(wasm::Function_*)>::function
            ((function<void_(wasm::Function_*)> *)&local_48,onChange);
  localizeCallsTo(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std
  ::allocator<wasm::Name>>const&,wasm::Module&,wasm::PassRunner*,std::function<void(wasm::
  Function*)>)::LocalizerPass::LocalizerPass(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std
  ::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,std::function<void(wasm::Function__>_
            (local_1a8,callTargets,(function<void_(wasm::Function_*)> *)&local_48);
  if (local_1a8[0].runner == runner || local_1a8[0].runner == (PassRunner *)0x0) {
    local_1a8[0].runner = runner;
    (*local_1a8[0]._vptr_Pass[2])(local_1a8,wasm);
    local_1a8[0]._vptr_Pass = (_func_int **)&PTR__LocalizerPass_010911b0;
    if (local_60 != (code *)0x0) {
      (*local_60)(local_70,local_70,3);
    }
    if (local_a0 != (void *)0x0) {
      operator_delete(local_a0,local_90 - (long)local_a0);
    }
    Pass::~Pass(local_1a8);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    return;
  }
  __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
}

Assistant:

void localizeCallsTo(const std::unordered_set<Name>& callTargets,
                     Module& wasm,
                     PassRunner* runner,
                     std::function<void(Function*)> onChange) {
  struct LocalizerPass : public WalkerPass<PostWalker<LocalizerPass>> {
    bool isFunctionParallel() override { return true; }

    std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets, onChange);
    }

    const std::unordered_set<Name>& callTargets;
    std::function<void(Function*)> onChange;

    LocalizerPass(const std::unordered_set<Name>& callTargets,
                  std::function<void(Function*)> onChange)
      : callTargets(callTargets), onChange(onChange) {}

    void visitCall(Call* curr) {
      if (!callTargets.count(curr->target)) {
        return;
      }

      ChildLocalizer localizer(
        curr, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != curr) {
        replaceCurrent(replacement);
        optimized = true;
        onChange(getFunction());
      }
    }

    bool optimized = false;

    void visitFunction(Function* curr) {
      if (optimized) {
        // Localization can add blocks, which might move pops.
        EHUtils::handleBlockNestedPops(curr, *getModule());
      }
    }
  };

  LocalizerPass(callTargets, onChange).run(runner, &wasm);
}